

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall Address_EmptyAddressTest_Test::TestBody(Address_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Address empty_address;
  AssertHelper local_330;
  string local_328;
  undefined1 local_308 [32];
  undefined1 local_2e8 [16];
  pointer local_2d8;
  pointer local_2c0;
  pointer local_2a8;
  TapBranch local_290;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_218;
  Script local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  Address local_190;
  
  cfd::core::Address::Address(&local_190);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_308,&local_190);
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_328,"\"\"","empty_address.GetAddress().c_str()","",
             (char *)local_308._0_8_);
  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
    operator_delete((void *)local_308._0_8_);
  }
  if ((char)local_328._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_308);
    if ((undefined8 *)local_328._M_string_length != (undefined8 *)0x0) {
      message = *(char **)local_328._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_330,(Message *)local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if ((long *)local_308._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_308._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_308._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
    cfd::core::Address::Address((Address *)local_308,&local_328);
    cfd::core::Address::operator=(&local_190,(Address *)local_308);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c0);
    cfd::core::Script::~Script(&local_200);
    local_290._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_218);
    cfd::core::TapBranch::~TapBranch(&local_290);
    if (local_2a8 != (pointer)0x0) {
      operator_delete(local_2a8);
    }
    if (local_2c0 != (pointer)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (pointer)0x0) {
      operator_delete(local_2d8);
    }
    if ((undefined1 *)local_308._16_8_ != local_2e8) {
      operator_delete((void *)local_308._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_308);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_328,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x2d,
             "Expected: (empty_address = Address(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_328,(Message *)local_308);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_328);
  if ((long *)local_308._0_8_ != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_308._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_308._0_8_ + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_190.format_data_);
  cfd::core::Script::~Script(&local_190.redeem_script_);
  local_190.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_190.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_190.script_tree_.super_TapBranch);
  if (local_190.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_190.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_190.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.address_._M_dataplus._M_p != &local_190.address_.field_2) {
    operator_delete(local_190.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, EmptyAddressTest) {
  Address empty_address;
  EXPECT_STREQ("", empty_address.GetAddress().c_str());

  EXPECT_THROW((empty_address = Address("")), CfdException);
}